

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcPropertySet::IfcPropertySet(IfcPropertySet *this)

{
  IfcPropertySet *this_local;
  
  STEP::Object::Object((Object *)&this->field_0xd0,"IfcPropertySet");
  IfcPropertySetDefinition::IfcPropertySetDefinition
            (&this->super_IfcPropertySetDefinition,&PTR_construction_vtable_24__01008db8);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertySet,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertySet,_1UL> *)
             &(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.field_0xa8,
             &PTR_construction_vtable_24__01008e30);
  (this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper =
       (_func_int **)0x1008d00;
  *(undefined8 *)&this->field_0xd0 = 0x1008da0;
  *(undefined8 *)
   &(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.field_0x88 =
       0x1008d28;
  *(undefined8 *)
   &(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.field_0x98 =
       0x1008d50;
  *(undefined8 *)&(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.field_0xa8 =
       0x1008d78;
  STEP::ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_1UL,_0UL>::ListOf
            ((ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_1UL,_0UL> *)
             &(this->super_IfcPropertySetDefinition).field_0xb8);
  return;
}

Assistant:

IfcPropertySet() : Object("IfcPropertySet") {}